

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent.cpp
# Opt level: O1

QObject * __thiscall QPointerEvent::exclusiveGrabber(QPointerEvent *this,QEventPoint *point)

{
  QPointingDevicePrivate *this_00;
  Data *pDVar1;
  int id;
  EventPointData *pEVar2;
  QDebug *pQVar3;
  QObject *pQVar4;
  long in_FS_OFFSET;
  QDebug local_40;
  QEventPoint local_38;
  undefined1 local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QPointingDevicePrivate **)&((this->super_QInputEvent).m_dev)->field_0x8;
  id = QEventPoint::id(point);
  pEVar2 = QPointingDevicePrivate::queryPointById(this_00,id);
  if (pEVar2 == (EventPointData *)0x0) {
    QMessageLogger::warning();
    pQVar3 = QDebug::operator<<(&local_40,"point is not in activePoints");
    local_38.d.d.ptr = (QExplicitlySharedDataPointer<QEventPointPrivate>)pQVar3->stream;
    *(int *)((long)local_38.d.d.ptr + 0x28) = *(int *)((long)local_38.d.d.ptr + 0x28) + 1;
    ::operator<<((Stream *)local_30,&local_38);
    QDebug::~QDebug((QDebug *)local_30);
    QDebug::~QDebug((QDebug *)&local_38);
    QDebug::~QDebug(&local_40);
  }
  else {
    pDVar1 = (pEVar2->exclusiveGrabber).wp.d;
    if ((pDVar1 != (Data *)0x0) && ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i != 0)
       ) {
      pQVar4 = (pEVar2->exclusiveGrabber).wp.value;
      goto LAB_002c3820;
    }
  }
  pQVar4 = (QObject *)0x0;
LAB_002c3820:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pQVar4;
  }
  __stack_chk_fail();
}

Assistant:

QObject *QPointerEvent::exclusiveGrabber(const QEventPoint &point) const
{
    Q_ASSERT(pointingDevice());
    auto persistentPoint = QPointingDevicePrivate::get(pointingDevice())->queryPointById(point.id());
    if (Q_UNLIKELY(!persistentPoint)) {
        qWarning() << "point is not in activePoints" << point;
        return nullptr;
    }
    return persistentPoint->exclusiveGrabber;
}